

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xmlIO.c
# Opt level: O1

int xmlParserInputBufferCreateUrl
              (char *URI,xmlCharEncoding enc,int flags,xmlParserInputBufferPtr *out)

{
  code *pcVar1;
  xmlParserInputBufferPtr *ppxVar2;
  int iVar3;
  xmlParserInputBufferPtr buf;
  void *pvVar4;
  int flags_00;
  undefined8 *puVar5;
  int iVar6;
  int iVar7;
  bool bVar8;
  int fd;
  int local_3c;
  xmlParserInputBufferPtr *local_38;
  
  xmlInitParser();
  *out = (xmlParserInputBufferPtr)0x0;
  if (URI == (char *)0x0) {
    iVar6 = 0x73;
  }
  else {
    buf = xmlAllocParserInputBuffer(enc);
    if (buf == (xmlParserInputBufferPtr)0x0) {
      iVar6 = 2;
    }
    else {
      iVar7 = xmlInputCallbackNr + 1;
      puVar5 = (undefined8 *)(&DAT_00218e08 + (ulong)(uint)xmlInputCallbackNr * 0x20);
      iVar6 = 0x5f4;
      local_38 = out;
      do {
        iVar7 = iVar7 + -1;
        if (iVar7 < 1) break;
        pcVar1 = (code *)puVar5[-3];
        if (pcVar1 == xmlIODefaultMatch) {
          iVar6 = xmlFdOpen(URI,0,&local_3c);
          iVar3 = local_3c;
          if (iVar6 == 0) {
            iVar6 = xmlInputFromFd(buf,local_3c,flags_00);
            close(iVar3);
          }
          bVar8 = iVar6 == 0x5f4;
        }
        else {
          bVar8 = true;
          if (pcVar1 != (code *)0x0) {
            iVar3 = (*pcVar1)(URI);
            if (iVar3 != 0) {
              pvVar4 = (void *)(*(code *)puVar5[-2])(URI);
              buf->context = pvVar4;
              if (pvVar4 != (void *)0x0) {
                buf->readcallback = (xmlInputReadCallback)puVar5[-1];
                buf->closecallback = (xmlInputCloseCallback)*puVar5;
                iVar6 = 0;
                bVar8 = false;
              }
            }
          }
        }
        puVar5 = puVar5 + -4;
      } while (bVar8);
      ppxVar2 = local_38;
      if (iVar6 == 0) {
        iVar6 = 0;
      }
      else {
        xmlFreeParserInputBuffer(buf);
        buf = (xmlParserInputBufferPtr)0x0;
      }
      *ppxVar2 = buf;
    }
  }
  return iVar6;
}

Assistant:

int
xmlParserInputBufferCreateUrl(const char *URI, xmlCharEncoding enc,
                              int flags, xmlParserInputBufferPtr *out) {
    xmlParserInputBufferPtr buf;
    int ret;
    int i;

    xmlInitParser();

    *out = NULL;
    if (URI == NULL)
        return(XML_ERR_ARGUMENT);

    /*
     * Allocate the Input buffer front-end.
     */
    buf = xmlAllocParserInputBuffer(enc);
    if (buf == NULL)
        return(XML_ERR_NO_MEMORY);

    /*
     * Try to find one of the input accept method accepting that scheme
     * Go in reverse to give precedence to user defined handlers.
     */
    ret = XML_IO_ENOENT;
    for (i = xmlInputCallbackNr - 1; i >= 0; i--) {
        xmlInputCallback *cb = &xmlInputCallbackTable[i];

        if (cb->matchcallback == xmlIODefaultMatch) {
            ret = xmlInputDefaultOpen(buf, URI, flags);

            if ((ret == XML_ERR_OK) || (ret != XML_IO_ENOENT))
                break;
        } else if ((cb->matchcallback != NULL) &&
                   (cb->matchcallback(URI) != 0)) {
            buf->context = cb->opencallback(URI);
            if (buf->context != NULL) {
                buf->readcallback = cb->readcallback;
                buf->closecallback = cb->closecallback;
                ret = XML_ERR_OK;
                break;
            }
        }
    }
    if (ret != XML_ERR_OK) {
        xmlFreeParserInputBuffer(buf);
        *out = NULL;
	return(ret);
    }

    *out = buf;
    return(ret);
}